

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<int,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::insert_value_on_rehash
          (robin_hash<std::pair<unsigned_long,_ImputedData<int,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<int,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           *this,size_t ibucket,distance_type dist_from_ideal_bucket,truncated_hash_type hash,
          value_type *value)

{
  short sVar1;
  short __tmp;
  short sVar2;
  bucket_entry *pbVar3;
  
  do {
    sVar1 = this->m_buckets[ibucket].m_dist_from_ideal_bucket;
    sVar2 = dist_from_ideal_bucket;
    if (sVar1 < dist_from_ideal_bucket) {
      pbVar3 = this->m_buckets + ibucket;
      if (sVar1 == -1) {
        std::pair<unsigned_long,_ImputedData<int,_double>_>::pair
                  ((pair<unsigned_long,_ImputedData<int,_double>_> *)pbVar3->m_value,value);
        pbVar3->m_dist_from_ideal_bucket = dist_from_ideal_bucket;
        return;
      }
      std::pair<unsigned_long,_ImputedData<int,_double>_>::swap
                (value,(pair<unsigned_long,_ImputedData<int,_double>_> *)pbVar3->m_value);
      sVar2 = pbVar3->m_dist_from_ideal_bucket;
      pbVar3->m_dist_from_ideal_bucket = dist_from_ideal_bucket;
    }
    dist_from_ideal_bucket = sVar2 + 1;
    ibucket = ibucket + 1 & (this->super_power_of_two_growth_policy<2UL>).m_mask;
  } while( true );
}

Assistant:

void insert_value_on_rehash(std::size_t ibucket,
                              distance_type dist_from_ideal_bucket,
                              truncated_hash_type hash, value_type&& value) {
    while (true) {
      if (dist_from_ideal_bucket >
          m_buckets[ibucket].dist_from_ideal_bucket()) {
        if (m_buckets[ibucket].empty()) {
          m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket,
                                                       hash, std::move(value));
          return;
        } else {
          m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket,
                                                       hash, value);
        }
      }

      dist_from_ideal_bucket++;
      ibucket = next_bucket(ibucket);
    }
  }